

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O3

uint32_t lzma_mf_find(lzma_mf *mf,uint32_t *count_ptr,lzma_match *matches)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint8_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar2 = (*mf->find)(mf,matches);
  if (uVar2 == 0) {
    uVar5 = 0;
  }
  else {
    uVar1 = mf->nice_len;
    uVar8 = (ulong)uVar1;
    uVar9 = 0;
    do {
      if (uVar1 < matches[uVar9].len) {
        __assert_fail("matches[i].len <= mf->nice_len",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x26,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
      uVar4 = mf->read_pos;
      uVar10 = (ulong)uVar4;
      if (uVar4 <= matches[uVar9].dist) {
        __assert_fail("matches[i].dist < mf->read_pos",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x27,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
      puVar7 = mf->buffer;
      iVar3 = bcmp(puVar7 + (uVar10 - 1),puVar7 + (uVar10 - matches[uVar9].dist) + -2,
                   (ulong)matches[uVar9].len);
      if (iVar3 != 0) {
        __assert_fail("memcmp(mf_ptr(mf) - 1, mf_ptr(mf) - matches[i].dist - 2, matches[i].len) == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x2a,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
    uVar5 = matches[uVar2 - 1].len;
    if (matches[uVar2 - 1].len == uVar1) {
      uVar4 = (mf->write_pos - uVar4) + 1;
      if (mf->match_len_max <= uVar4) {
        uVar4 = mf->match_len_max;
      }
      uVar5 = uVar1;
      if (uVar1 < uVar4) {
        puVar7 = puVar7 + uVar10 + uVar8;
        lVar6 = uVar4 - uVar8;
        do {
          uVar5 = (uint)uVar8;
          if (puVar7[-1] != puVar7[-2 - (ulong)matches[uVar2 - 1].dist]) break;
          uVar8 = (ulong)((uint)uVar8 + 1);
          puVar7 = puVar7 + 1;
          lVar6 = lVar6 + -1;
          uVar5 = uVar4;
        } while (lVar6 != 0);
      }
    }
  }
  *count_ptr = uVar2;
  mf->read_ahead = mf->read_ahead + 1;
  return uVar5;
}

Assistant:

extern uint32_t
lzma_mf_find(lzma_mf *mf, uint32_t *count_ptr, lzma_match *matches)
{
	// Call the match finder. It returns the number of length-distance
	// pairs found.
	// FIXME: Minimum count is zero, what _exactly_ is the maximum?
	const uint32_t count = mf->find(mf, matches);

	// Length of the longest match; assume that no matches were found
	// and thus the maximum length is zero.
	uint32_t len_best = 0;

	if (count > 0) {
#ifndef NDEBUG
		uint32_t i;
		// Validate the matches.
		for (i = 0; i < count; ++i) {
			assert(matches[i].len <= mf->nice_len);
			assert(matches[i].dist < mf->read_pos);
			assert(memcmp(mf_ptr(mf) - 1,
				mf_ptr(mf) - matches[i].dist - 2,
				matches[i].len) == 0);
		}
#endif

		// The last used element in the array contains
		// the longest match.
		len_best = matches[count - 1].len;

		// If a match of maximum search length was found, try to
		// extend the match to maximum possible length.
		if (len_best == mf->nice_len) {
			uint8_t *p1;
			uint8_t *p2;

			// The limit for the match length is either the
			// maximum match length supported by the LZ-based
			// encoder or the number of bytes left in the
			// dictionary, whichever is smaller.
			uint32_t limit = mf_avail(mf) + 1;
			if (limit > mf->match_len_max)
				limit = mf->match_len_max;

			// Pointer to the byte we just ran through
			// the match finder.
			p1 = mf_ptr(mf) - 1;

			// Pointer to the beginning of the match. We need -1
			// here because the match distances are zero based.
			p2 = p1 - matches[count - 1].dist - 1;

			while (len_best < limit
					&& p1[len_best] == p2[len_best])
				++len_best;
		}
	}

	*count_ptr = count;

	// Finally update the read position to indicate that match finder was
	// run for this dictionary offset.
	++mf->read_ahead;

	return len_best;
}